

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPathIdentifier(AsciiParser *this,string *path_identifier)

{
  int *piVar1;
  bool bVar2;
  long lVar3;
  allocator local_22a;
  allocator local_229;
  string local_228 [32];
  allocator local_208 [32];
  char c;
  string local_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar2 = Expect(this,'<');
  if (bVar2) {
    bVar2 = SkipWhitespace(this);
    if (bVar2) {
      while( true ) {
        bVar2 = Eof(this);
        if (bVar2) break;
        bVar2 = Char1(this,&c);
        if (!bVar2) break;
        if (c == '>') {
          piVar1 = &(this->_curr_cursor).col;
          *piVar1 = *piVar1 + 1;
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::string((string *)&c," \n\r\t\f\v",local_208);
          ::std::__cxx11::string::string(local_228,local_1c8);
          lVar3 = ::std::__cxx11::string::find_first_not_of(local_228,(ulong)&c);
          if (lVar3 == -1) {
            ::std::__cxx11::string::string((string *)local_208,"",&local_229);
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_208,(ulong)local_228);
          }
          ::std::__cxx11::string::operator=(local_228,(string *)local_208);
          ::std::__cxx11::string::_M_dispose();
          lVar3 = ::std::__cxx11::string::find_last_not_of(local_228,(ulong)&c);
          if (lVar3 == -1) {
            ::std::__cxx11::string::string((string *)local_208,"",&local_22a);
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_208,(ulong)local_228);
          }
          ::std::__cxx11::string::operator=(local_228,(string *)local_208);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::operator=((string *)path_identifier,local_228);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          bVar2 = true;
          goto LAB_002d3161;
        }
        ::std::operator<<(local_198,c);
      }
    }
  }
  bVar2 = false;
LAB_002d3161:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar2;
}

Assistant:

bool AsciiParser::ReadPathIdentifier(std::string *path_identifier) {
  // path_identifier = `<` string `>`
  std::stringstream ss;

  if (!Expect('<')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  // read until '>'
  bool ok = false;
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '>') {
      // end
      ok = true;
      _curr_cursor.col++;
      break;
    }

    // TODO: Check if character is valid for path identifier
    ss << c;
  }

  if (!ok) {
    return false;
  }

  (*path_identifier) = TrimString(ss.str());
  // std::cout << "PathIdentifier: " << (*path_identifier) << "\n";

  return true;
}